

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall TArray<FName,_FName>::ShrinkToFit(TArray<FName,_FName> *this)

{
  uint uVar1;
  FName *pFVar2;
  
  uVar1 = this->Count;
  if (uVar1 < this->Most) {
    this->Most = uVar1;
    if (uVar1 == 0) {
      if (this->Array == (FName *)0x0) {
        return;
      }
      M_Free(this->Array);
      pFVar2 = (FName *)0x0;
    }
    else {
      pFVar2 = (FName *)M_Realloc_Dbg(this->Array,(ulong)uVar1 << 2,
                                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                                      ,0x1ad);
    }
    this->Array = pFVar2;
  }
  return;
}

Assistant:

void ShrinkToFit ()
	{
		if (Most > Count)
		{
			Most = Count;
			if (Most == 0)
			{
				if (Array != NULL)
				{
					M_Free (Array);
					Array = NULL;
				}
			}
			else
			{
				DoResize ();
			}
		}
	}